

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfad.h
# Opt level: O2

void __thiscall
TFad<6,double>::
TFad<TFadBinaryAdd<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>>>,TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>>>
          (TFad<6,double> *this,
          TFadExpr<TFadBinaryAdd<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>
          *fadexpr)

{
  int i;
  long lVar1;
  value_type vVar2;
  
  *(undefined ***)this = &PTR__TFad_0166af08;
  vVar2 = TFadBinaryAdd<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>
          ::val(&fadexpr->fadexpr_);
  *(value_type *)(this + 8) = vVar2;
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    vVar2 = TFadBinaryAdd<TFadExpr<TFadUnaryMin<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>
            ::dx(&fadexpr->fadexpr_,(int)lVar1);
    *(value_type *)(this + lVar1 * 8 + 0x10) = vVar2;
  }
  return;
}

Assistant:

inline 
TFad<Num,T>::TFad(const TFadExpr<ExprT>& fadexpr) 
: val_(fadexpr.val())
{

  for(int i=0; i<Num; ++i) 
    dx_[i] = fadexpr.dx(i);

}